

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqliteArchive.cpp
# Opt level: O0

void __thiscall
gtar::SqliteArchive::writePtr
          (SqliteArchive *this,string *path,void *contents,size_t byteLength,CompressMode mode,
          bool immediate)

{
  sqlite3_stmt *psVar1;
  value_type pcVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  runtime_error *prVar6;
  int *piVar7;
  unsigned_long *puVar8;
  char *pcVar9;
  reference pvVar10;
  reference pvVar11;
  size_type sVar12;
  reference ppcVar13;
  ostream *poVar14;
  string local_4f8 [32];
  stringstream local_4d8 [8];
  stringstream result_1;
  ostream local_4c8 [376];
  ulong local_350;
  size_t chunkidx_4;
  string local_340 [32];
  stringstream local_320 [8];
  stringstream result;
  ostream local_310 [376];
  ulong local_198;
  size_t chunkidx_3;
  value_type_conflict2 vStack_188;
  int status;
  value_type local_180;
  unsigned_long local_178 [2];
  int local_164;
  long lStack_160;
  int sourceSize_2;
  size_t chunkidx_2;
  value_type_conflict2 local_150;
  char *local_148;
  SharedArray<char> local_140;
  int local_134;
  int local_130;
  int maxSize_1;
  unsigned_long local_128;
  int local_120 [2];
  ulong local_118;
  int local_10c;
  int local_108;
  int sourceSize_1;
  long local_100;
  size_t chunkidx_1;
  value_type_conflict2 local_f0;
  char *local_e8;
  SharedArray<char> local_e0;
  int local_d4;
  int local_d0;
  int maxSize;
  unsigned_long local_c8;
  int local_c0 [2];
  ulong local_b8;
  int local_ac;
  int local_a8;
  int sourceSize;
  long local_a0;
  size_t chunkidx;
  vector<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_> compressedBytes;
  size_t sStack_78;
  uint rawCompression;
  size_t compressedSize;
  vector<unsigned_long,_std::allocator<unsigned_long>_> rawSizes;
  vector<const_char_*,_std::allocator<const_char_*>_> rawTargets;
  bool immediate_local;
  CompressMode mode_local;
  size_t byteLength_local;
  void *contents_local;
  string *path_local;
  SqliteArchive *this_local;
  
  if (this->m_mode == Read) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Can\'t write to an archive opened for reading");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)
             &rawSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&compressedSize);
  sStack_78 = 0;
  compressedBytes.
  super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>::vector
            ((vector<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_> *)&chunkidx
            );
  if ((mode == FastCompress) || (mode == MediumCompress)) {
    local_a0 = 0;
    while( true ) {
      lVar4 = local_a0;
      sourceSize = 0x7e000000;
      local_a8 = 1000000000;
      piVar7 = std::min<int>(&sourceSize,&local_a8);
      if (byteLength <= (ulong)(lVar4 * *piVar7) >> 1) break;
      local_c0[1] = 0x7e000000;
      local_c0[0] = 1000000000;
      piVar7 = std::min<int>(local_c0 + 1,local_c0);
      lVar4 = local_a0;
      local_b8 = (ulong)(long)*piVar7 >> 1;
      maxSize = 0x7e000000;
      local_d0 = 1000000000;
      piVar7 = std::min<int>(&maxSize,&local_d0);
      local_c8 = byteLength - ((ulong)(lVar4 * *piVar7) >> 1);
      puVar8 = std::min<unsigned_long>(&local_b8,&local_c8);
      local_ac = (int)*puVar8;
      local_d4 = LZ4_compressBound(local_ac);
      pcVar9 = (char *)operator_new__((long)local_d4);
      SharedArray<char>::SharedArray(&local_e0,pcVar9,(long)local_d4);
      std::vector<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>::push_back
                ((vector<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_> *)
                 &chunkidx,&local_e0);
      SharedArray<char>::~SharedArray(&local_e0);
      pvVar10 = std::vector<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>::
                back((vector<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_> *)
                     &chunkidx);
      local_e8 = SharedArray<char>::get(pvVar10);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                 &rawSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,&local_e8);
      lVar4 = local_a0;
      chunkidx_1._4_4_ = 0x7e000000;
      chunkidx_1._0_4_ = 1000000000;
      piVar7 = std::min<int>((int *)((long)&chunkidx_1 + 4),(int *)&chunkidx_1);
      iVar5 = *piVar7;
      pvVar10 = std::vector<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>::
                back((vector<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_> *)
                     &chunkidx);
      pcVar9 = SharedArray<char>::get(pvVar10);
      iVar5 = LZ4_compress_default
                        ((char *)((long)contents + ((ulong)(lVar4 * iVar5) >> 1)),pcVar9,local_ac,
                         local_d4);
      local_f0 = (value_type_conflict2)iVar5;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&compressedSize,&local_f0)
      ;
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&compressedSize)
      ;
      sStack_78 = *pvVar11 + sStack_78;
      local_a0 = local_a0 + 1;
    }
    compressedBytes.
    super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else if (mode == SlowCompress) {
    local_100 = 0;
    while( true ) {
      lVar4 = local_100;
      sourceSize_1 = 0x7e000000;
      local_108 = 1000000000;
      piVar7 = std::min<int>(&sourceSize_1,&local_108);
      if (byteLength <= (ulong)(lVar4 * *piVar7) >> 1) break;
      local_120[1] = 0x7e000000;
      local_120[0] = 1000000000;
      piVar7 = std::min<int>(local_120 + 1,local_120);
      lVar4 = local_100;
      local_118 = (ulong)(long)*piVar7 >> 1;
      maxSize_1 = 0x7e000000;
      local_130 = 1000000000;
      piVar7 = std::min<int>(&maxSize_1,&local_130);
      local_128 = byteLength - ((ulong)(lVar4 * *piVar7) >> 1);
      puVar8 = std::min<unsigned_long>(&local_118,&local_128);
      local_10c = (int)*puVar8;
      local_134 = LZ4_compressBound(local_10c);
      pcVar9 = (char *)operator_new__((long)local_134);
      SharedArray<char>::SharedArray(&local_140,pcVar9,(long)local_134);
      std::vector<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>::push_back
                ((vector<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_> *)
                 &chunkidx,&local_140);
      SharedArray<char>::~SharedArray(&local_140);
      pvVar10 = std::vector<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>::
                back((vector<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_> *)
                     &chunkidx);
      local_148 = SharedArray<char>::get(pvVar10);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                 &rawSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,&local_148);
      lVar4 = local_100;
      chunkidx_2._4_4_ = 0x7e000000;
      chunkidx_2._0_4_ = 1000000000;
      piVar7 = std::min<int>((int *)((long)&chunkidx_2 + 4),(int *)&chunkidx_2);
      iVar5 = *piVar7;
      pvVar10 = std::vector<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>::
                back((vector<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_> *)
                     &chunkidx);
      pcVar9 = SharedArray<char>::get(pvVar10);
      iVar5 = LZ4_compress_HC((char *)((long)contents + ((ulong)(lVar4 * iVar5) >> 1)),pcVar9,
                              local_10c,local_134,0xb);
      local_150 = (value_type_conflict2)iVar5;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&compressedSize,&local_150
                );
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&compressedSize)
      ;
      sStack_78 = *pvVar11 + sStack_78;
      local_100 = local_100 + 1;
    }
    compressedBytes.
    super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    for (lStack_160 = 0; sStack_78 = byteLength, (ulong)(lStack_160 * 1000000000) >> 1 < byteLength;
        lStack_160 = lStack_160 + 1) {
      local_178[1] = 500000000;
      local_178[0] = byteLength - ((ulong)(lStack_160 * 1000000000) >> 1);
      puVar8 = std::min<unsigned_long>(local_178 + 1,local_178);
      local_164 = (int)*puVar8;
      local_180 = (value_type)((long)contents + ((ulong)(lStack_160 * 1000000000) >> 1));
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                 &rawSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,&local_180);
      vStack_188 = (value_type_conflict2)local_164;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&compressedSize,
                 &stack0xfffffffffffffe78);
    }
  }
  psVar1 = this->m_insert_filename_stmt;
  pcVar9 = (char *)std::__cxx11::string::c_str();
  iVar5 = std::__cxx11::string::size();
  sqlite3_bind_text(psVar1,1,pcVar9,iVar5,(_func_void_void_ptr *)0x0);
  sqlite3_bind_int64(this->m_insert_filename_stmt,2,byteLength);
  sqlite3_bind_int64(this->m_insert_filename_stmt,3,sStack_78);
  sqlite3_bind_int(this->m_insert_filename_stmt,4,
                   compressedBytes.
                   super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  psVar1 = this->m_insert_contents_stmt;
  pcVar9 = (char *)std::__cxx11::string::c_str();
  iVar5 = std::__cxx11::string::size();
  sqlite3_bind_text(psVar1,1,pcVar9,iVar5,(_func_void_void_ptr *)0x0);
  chunkidx_3._4_4_ = 5;
  if (immediate) {
    while (chunkidx_3._4_4_ == 5) {
      chunkidx_3._4_4_ = sqlite3_step(this->m_begin_stmt);
      chunkidx_3._4_4_ = sqlite3_step(this->m_insert_filename_stmt);
      for (local_198 = 0; uVar3 = local_198,
          sVar12 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                             ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                              &rawSizes.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage), uVar3 < sVar12;
          local_198 = local_198 + 1) {
        psVar1 = this->m_insert_contents_stmt;
        ppcVar13 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                             ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                              &rawSizes.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,local_198);
        pcVar2 = *ppcVar13;
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &compressedSize,local_198);
        sqlite3_bind_blob(psVar1,2,pcVar2,(int)*pvVar11,(_func_void_void_ptr *)0x0);
        sqlite3_bind_int64(this->m_insert_contents_stmt,3,local_198);
        chunkidx_3._4_4_ = sqlite3_step(this->m_insert_contents_stmt);
        if (chunkidx_3._4_4_ != 0x65) {
          std::__cxx11::stringstream::stringstream(local_320);
          std::operator<<(local_310,"Couldn\'t insert chunk in sqlite database: ");
          pcVar9 = sqlite3_errstr(chunkidx_3._4_4_);
          std::operator<<(local_310,pcVar9);
          chunkidx_4._7_1_ = 1;
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringstream::str();
          std::runtime_error::runtime_error(prVar6,local_340);
          chunkidx_4._7_1_ = 0;
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        sqlite3_reset(this->m_insert_contents_stmt);
      }
      chunkidx_3._4_4_ = sqlite3_step(this->m_end_stmt);
    }
  }
  else {
    do {
      chunkidx_3._4_4_ = sqlite3_step(this->m_insert_filename_stmt);
    } while (chunkidx_3._4_4_ == 5);
    for (local_350 = 0; uVar3 = local_350,
        sVar12 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                           ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                            &rawSizes.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage), uVar3 < sVar12;
        local_350 = local_350 + 1) {
      psVar1 = this->m_insert_contents_stmt;
      ppcVar13 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                           ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                            &rawSizes.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,local_350);
      pcVar2 = *ppcVar13;
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&compressedSize,
                           local_350);
      sqlite3_bind_blob(psVar1,2,pcVar2,(int)*pvVar11,(_func_void_void_ptr *)0x0);
      sqlite3_bind_int64(this->m_insert_contents_stmt,3,local_350);
      do {
        chunkidx_3._4_4_ = sqlite3_step(this->m_insert_contents_stmt);
      } while (chunkidx_3._4_4_ == 5);
      sqlite3_reset(this->m_insert_contents_stmt);
    }
  }
  sqlite3_clear_bindings(this->m_insert_filename_stmt);
  sqlite3_clear_bindings(this->m_insert_contents_stmt);
  sqlite3_reset(this->m_begin_stmt);
  sqlite3_reset(this->m_insert_filename_stmt);
  sqlite3_reset(this->m_insert_contents_stmt);
  sqlite3_reset(this->m_end_stmt);
  if (chunkidx_3._4_4_ == 0x65) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->m_fileNames,path);
    std::vector<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>::~vector
              ((vector<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_> *)
               &chunkidx);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&compressedSize);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)
               &rawSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_4d8);
  poVar14 = std::operator<<(local_4c8,"Error inserting record at ");
  poVar14 = std::operator<<(poVar14,(string *)path);
  std::operator<<(poVar14,": ");
  pcVar9 = sqlite3_errmsg(this->m_connection);
  std::operator<<(local_4c8,pcVar9);
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(prVar6,local_4f8);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SqliteArchive::writePtr(const string &path, const void *contents,
                                 const size_t byteLength, CompressMode mode,
                                 bool immediate)
    {
        if(m_mode == Read)
            throw runtime_error("Can't write to an archive opened for reading");

        vector<const char*> rawTargets;
        vector<size_t> rawSizes;
        size_t compressedSize(0);
        unsigned int rawCompression(0);
        vector<SharedArray<char> > compressedBytes;

        if(mode == FastCompress || mode == MediumCompress)
        {
            for(size_t chunkidx(0); chunkidx*LZ4_CHUNK_SIZE < byteLength; ++chunkidx)
            {
                const int sourceSize(min((size_t) LZ4_CHUNK_SIZE, byteLength - chunkidx*LZ4_CHUNK_SIZE));
                const int maxSize(LZ4_compressBound(sourceSize));

                compressedBytes.push_back(SharedArray<char>(new char[maxSize], maxSize));
                rawTargets.push_back(compressedBytes.back().get());
                rawSizes.push_back(LZ4_compress_default(
                                       ((const char*) contents) + chunkidx*LZ4_CHUNK_SIZE,
                                       compressedBytes.back().get(), sourceSize,
                                       maxSize));
                compressedSize += rawSizes.back();
            }
            rawCompression = 1;
        }
        else if(mode == SlowCompress)
        {
            for(size_t chunkidx(0); chunkidx*LZ4_CHUNK_SIZE < byteLength; ++chunkidx)
            {
                const int sourceSize(min((size_t) LZ4_CHUNK_SIZE, byteLength - chunkidx*LZ4_CHUNK_SIZE));
                const int maxSize(LZ4_compressBound(sourceSize));

                compressedBytes.push_back(SharedArray<char>(new char[maxSize], maxSize));
                rawTargets.push_back(compressedBytes.back().get());
                rawSizes.push_back(LZ4_compress_HC(
                                       ((const char*) contents) + chunkidx*LZ4_CHUNK_SIZE,
                                       compressedBytes.back().get(), sourceSize,
                                       maxSize, LZ4HC_CLEVEL_OPT_MIN));
                compressedSize += rawSizes.back();
            }
            rawCompression = 1;
        }
        else
        {
            for(size_t chunkidx(0); chunkidx*RAW_CHUNK_SIZE < byteLength; ++chunkidx)
            {
                const int sourceSize(min((size_t) RAW_CHUNK_SIZE, byteLength - chunkidx*RAW_CHUNK_SIZE));
                rawTargets.push_back(((const char*) contents) + chunkidx*RAW_CHUNK_SIZE);
                rawSizes.push_back(sourceSize);
            }
            compressedSize = byteLength;
        }

        sqlite3_bind_text(m_insert_filename_stmt, 1, path.c_str(), path.size(), 0);
        sqlite3_bind_int64(m_insert_filename_stmt, 2, byteLength);
        sqlite3_bind_int64(m_insert_filename_stmt, 3, compressedSize);
        sqlite3_bind_int(m_insert_filename_stmt, 4, rawCompression);

        sqlite3_bind_text(m_insert_contents_stmt, 1, path.c_str(), path.size(), 0);

        int status(SQLITE_BUSY);

        if(immediate)
        {
            while(status == SQLITE_BUSY)
            {
                status = sqlite3_step(m_begin_stmt);

                status = sqlite3_step(m_insert_filename_stmt);

                for(size_t chunkidx(0); chunkidx < rawTargets.size(); ++chunkidx)
                {
                    sqlite3_bind_blob(m_insert_contents_stmt, 2, (const void*) rawTargets[chunkidx],
                                        rawSizes[chunkidx], 0);
                    sqlite3_bind_int64(m_insert_contents_stmt, 3, chunkidx);
                    status = sqlite3_step(m_insert_contents_stmt);

                    if(status != SQLITE_DONE)
                    {
                        stringstream result;
                        result << "Couldn't insert chunk in sqlite database: ";
                        result << sqlite3_errstr(status);
                        throw runtime_error(result.str());
                    }

                    sqlite3_reset(m_insert_contents_stmt);
                }

                status = sqlite3_step(m_end_stmt);
            }
        }
        else
        {
            do {status = sqlite3_step(m_insert_filename_stmt);} while(status == SQLITE_BUSY);

            for(size_t chunkidx(0); chunkidx < rawTargets.size(); ++chunkidx)
            {
                sqlite3_bind_blob(m_insert_contents_stmt, 2, (const void*) rawTargets[chunkidx],
                                    rawSizes[chunkidx], 0);
                sqlite3_bind_int64(m_insert_contents_stmt, 3, chunkidx);
                do {status = sqlite3_step(m_insert_contents_stmt);} while(status == SQLITE_BUSY);
                sqlite3_reset(m_insert_contents_stmt);
            }
        }

        sqlite3_clear_bindings(m_insert_filename_stmt);
        sqlite3_clear_bindings(m_insert_contents_stmt);
        sqlite3_reset(m_begin_stmt);
        sqlite3_reset(m_insert_filename_stmt);
        sqlite3_reset(m_insert_contents_stmt);
        sqlite3_reset(m_end_stmt);

        if(status != SQLITE_DONE)
        {
            stringstream result;
            result << "Error inserting record at " << path << ": ";
            result << sqlite3_errmsg(m_connection);
            throw runtime_error(result.str());
        }

        m_fileNames.push_back(path);
    }